

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O3

void __thiscall
spvtools::FriendlyNameMapper::SaveBuiltInName
          (FriendlyNameMapper *this,uint32_t target_id,uint32_t built_in)

{
  char *pcVar1;
  char *pcVar2;
  string local_40;
  
  switch(built_in) {
  case 0:
    pcVar2 = "gl_Position";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "gl_PointSize";
    pcVar1 = "";
    break;
  case 2:
  case 0x15:
  case 0x23:
    goto switchD_0061e63d_caseD_2;
  case 3:
    pcVar2 = "gl_ClipDistance";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "gl_CullDistance";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "gl_VertexID";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "gl_InstanceID";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "gl_PrimitiveID";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "gl_InvocationID";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "gl_Layer";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "gl_ViewportIndex";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "gl_TessLevelOuter";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "gl_TessLevelInner";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "gl_TessCoord";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "gl_PatchVertices";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "gl_FragCoord";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "gl_PointCoord";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "gl_FrontFacing";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "gl_SampleID";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "gl_SamplePosition";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "gl_SampleMask";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "gl_FragDepth";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "gl_HelperInvocation";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "gl_NumWorkGroups";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "gl_WorkGroupSize";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "gl_WorkGroupID";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "gl_LocalInvocationID";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "gl_GlobalInvocationID";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "gl_LocalInvocationIndex";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "WorkDim";
    pcVar1 = "";
    break;
  case 0x1f:
    pcVar2 = "GlobalSize";
    pcVar1 = "";
    break;
  case 0x20:
    pcVar2 = "EnqueuedWorkgroupSize";
    pcVar1 = "";
    break;
  case 0x21:
    pcVar2 = "GlobalOffset";
    pcVar1 = "";
    break;
  case 0x22:
    pcVar2 = "GlobalLinearId";
    pcVar1 = "";
    break;
  case 0x24:
    pcVar2 = "SubgroupSize";
    pcVar1 = "";
    break;
  case 0x25:
    pcVar2 = "SubgroupMaxSize";
    pcVar1 = "";
    break;
  case 0x26:
    pcVar2 = "NumSubgroups";
    pcVar1 = "";
    break;
  case 0x27:
    pcVar2 = "NumEnqueuedSubgroups";
    pcVar1 = "";
    break;
  case 0x28:
    pcVar2 = "SubgroupId";
    pcVar1 = "";
    break;
  case 0x29:
    pcVar2 = "SubgroupLocalInvocationId";
    pcVar1 = "";
    break;
  case 0x2a:
    pcVar2 = "gl_VertexIndex";
    pcVar1 = "";
    break;
  case 0x2b:
    pcVar2 = "gl_InstanceIndex";
    pcVar1 = "";
    break;
  default:
    switch(built_in) {
    case 0x1140:
      pcVar2 = "SubgroupEqMaskKHR";
      pcVar1 = "";
      break;
    case 0x1141:
      pcVar2 = "SubgroupGeMaskKHR";
      pcVar1 = "";
      break;
    case 0x1142:
      pcVar2 = "SubgroupGtMaskKHR";
      pcVar1 = "";
      break;
    case 0x1143:
      pcVar2 = "SubgroupLeMaskKHR";
      pcVar1 = "";
      break;
    case 0x1144:
      pcVar2 = "SubgroupLtMaskKHR";
      pcVar1 = "";
      break;
    default:
      goto switchD_0061e63d_caseD_2;
    case 0x1149:
      pcVar2 = "gl_BaseInstance";
      pcVar1 = "";
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar2,pcVar1);
  SaveName(this,target_id,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
switchD_0061e63d_caseD_2:
  return;
}

Assistant:

void FriendlyNameMapper::SaveBuiltInName(uint32_t target_id,
                                         uint32_t built_in) {
#define GLCASE(name)                  \
  case spv::BuiltIn::name:            \
    SaveName(target_id, "gl_" #name); \
    return;
#define GLCASE2(name, suggested)           \
  case spv::BuiltIn::name:                 \
    SaveName(target_id, "gl_" #suggested); \
    return;
#define CASE(name)              \
  case spv::BuiltIn::name:      \
    SaveName(target_id, #name); \
    return;
  switch (spv::BuiltIn(built_in)) {
    GLCASE(Position)
    GLCASE(PointSize)
    GLCASE(ClipDistance)
    GLCASE(CullDistance)
    GLCASE2(VertexId, VertexID)
    GLCASE2(InstanceId, InstanceID)
    GLCASE2(PrimitiveId, PrimitiveID)
    GLCASE2(InvocationId, InvocationID)
    GLCASE(Layer)
    GLCASE(ViewportIndex)
    GLCASE(TessLevelOuter)
    GLCASE(TessLevelInner)
    GLCASE(TessCoord)
    GLCASE(PatchVertices)
    GLCASE(FragCoord)
    GLCASE(PointCoord)
    GLCASE(FrontFacing)
    GLCASE2(SampleId, SampleID)
    GLCASE(SamplePosition)
    GLCASE(SampleMask)
    GLCASE(FragDepth)
    GLCASE(HelperInvocation)
    GLCASE2(NumWorkgroups, NumWorkGroups)
    GLCASE2(WorkgroupSize, WorkGroupSize)
    GLCASE2(WorkgroupId, WorkGroupID)
    GLCASE2(LocalInvocationId, LocalInvocationID)
    GLCASE2(GlobalInvocationId, GlobalInvocationID)
    GLCASE(LocalInvocationIndex)
    CASE(WorkDim)
    CASE(GlobalSize)
    CASE(EnqueuedWorkgroupSize)
    CASE(GlobalOffset)
    CASE(GlobalLinearId)
    CASE(SubgroupSize)
    CASE(SubgroupMaxSize)
    CASE(NumSubgroups)
    CASE(NumEnqueuedSubgroups)
    CASE(SubgroupId)
    CASE(SubgroupLocalInvocationId)
    GLCASE(VertexIndex)
    GLCASE(InstanceIndex)
    GLCASE(BaseInstance)
    CASE(SubgroupEqMaskKHR)
    CASE(SubgroupGeMaskKHR)
    CASE(SubgroupGtMaskKHR)
    CASE(SubgroupLeMaskKHR)
    CASE(SubgroupLtMaskKHR)
    default:
      break;
  }
#undef GLCASE
#undef GLCASE2
#undef CASE
}